

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void FTransformWHT_C(int16_t *in,int16_t *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int b3;
  int b2;
  int b1;
  int b0;
  int a3_1;
  int a2_1;
  int a1_1;
  int a0_1;
  int a3;
  int a2;
  int a1;
  int a0;
  int i;
  int32_t tmp [16];
  
  tmp._48_8_ = in_RSI;
  tmp._56_8_ = in_RDI;
  for (a1_1 = 0; a1_1 < 4; a1_1 = a1_1 + 1) {
    iVar5 = (int)*(short *)tmp._56_8_ + (int)*(short *)(tmp._56_8_ + 0x40);
    iVar6 = (int)*(short *)(tmp._56_8_ + 0x20) + (int)*(short *)(tmp._56_8_ + 0x60);
    iVar7 = (int)*(short *)(tmp._56_8_ + 0x20) - (int)*(short *)(tmp._56_8_ + 0x60);
    iVar8 = (int)*(short *)tmp._56_8_ - (int)*(short *)(tmp._56_8_ + 0x40);
    (&a0_1)[a1_1 << 2] = iVar5 + iVar6;
    (&a0_1)[a1_1 * 4 + 1] = iVar8 + iVar7;
    (&a0_1)[a1_1 * 4 + 2] = iVar8 - iVar7;
    (&a0_1)[a1_1 * 4 + 3] = iVar5 - iVar6;
    tmp._56_8_ = tmp._56_8_ + 0x80;
  }
  for (a1_1 = 0; a1_1 < 4; a1_1 = a1_1 + 1) {
    iVar5 = (&a0_1)[a1_1];
    iVar6 = (&a0_1)[a1_1 + 8];
    iVar7 = (&a0_1)[a1_1 + 4];
    iVar8 = (&a0_1)[a1_1 + 0xc];
    iVar1 = (&a0_1)[a1_1 + 4];
    iVar2 = (&a0_1)[a1_1 + 0xc];
    iVar3 = (&a0_1)[a1_1];
    iVar4 = (&a0_1)[a1_1 + 8];
    *(short *)(tmp._48_8_ + (long)a1_1 * 2) = (short)(iVar5 + iVar6 + iVar7 + iVar8 >> 1);
    *(short *)(tmp._48_8_ + (long)(a1_1 + 4) * 2) = (short)((iVar3 - iVar4) + (iVar1 - iVar2) >> 1);
    *(short *)(tmp._48_8_ + (long)(a1_1 + 8) * 2) = (short)((iVar3 - iVar4) - (iVar1 - iVar2) >> 1);
    *(short *)(tmp._48_8_ + (long)(a1_1 + 0xc) * 2) =
         (short)((iVar5 + iVar6) - (iVar7 + iVar8) >> 1);
  }
  return;
}

Assistant:

static void FTransformWHT_C(const int16_t* WEBP_RESTRICT in,
                            int16_t* WEBP_RESTRICT out) {
  // input is 12b signed
  int32_t tmp[16];
  int i;
  for (i = 0; i < 4; ++i, in += 64) {
    const int a0 = (in[0 * 16] + in[2 * 16]);  // 13b
    const int a1 = (in[1 * 16] + in[3 * 16]);
    const int a2 = (in[1 * 16] - in[3 * 16]);
    const int a3 = (in[0 * 16] - in[2 * 16]);
    tmp[0 + i * 4] = a0 + a1;   // 14b
    tmp[1 + i * 4] = a3 + a2;
    tmp[2 + i * 4] = a3 - a2;
    tmp[3 + i * 4] = a0 - a1;
  }
  for (i = 0; i < 4; ++i) {
    const int a0 = (tmp[0 + i] + tmp[8 + i]);  // 15b
    const int a1 = (tmp[4 + i] + tmp[12+ i]);
    const int a2 = (tmp[4 + i] - tmp[12+ i]);
    const int a3 = (tmp[0 + i] - tmp[8 + i]);
    const int b0 = a0 + a1;    // 16b
    const int b1 = a3 + a2;
    const int b2 = a3 - a2;
    const int b3 = a0 - a1;
    out[ 0 + i] = b0 >> 1;     // 15b
    out[ 4 + i] = b1 >> 1;
    out[ 8 + i] = b2 >> 1;
    out[12 + i] = b3 >> 1;
  }
}